

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Data::SlowWrite(Data *this,void *data,uint byteSize)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  void *pvStack_28;
  uint bytesFree;
  byte *dataToBeWritten;
  uint bytesLeftToWrite;
  uint byteSize_local;
  void *data_local;
  Data *this_local;
  
  uVar3 = DataChunk::RemainingBytes(this->current);
  if (byteSize <= uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd83,"(byteSize > current->RemainingBytes())",
                                "We should not need an extension if there is enough space in the current chunk"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pvStack_28 = data;
  dataToBeWritten._0_4_ = byteSize;
  if (this->current->nextChunk != (DataChunk *)0x0) {
    DataChunk::SetCurrentOffset(this->current->nextChunk,0);
  }
  while (uVar3 = DataChunk::RemainingBytes(this->current), uVar3 < (uint)dataToBeWritten) {
    DataChunk::WriteUnsafe(this->current,pvStack_28,uVar3);
    dataToBeWritten._0_4_ = (uint)dataToBeWritten - uVar3;
    pvStack_28 = (void *)((long)pvStack_28 + (ulong)uVar3);
    if (this->current->nextChunk == (DataChunk *)0x0) {
      AddChunk(this,(uint)dataToBeWritten);
    }
    this->current = this->current->nextChunk;
  }
  DataChunk::WriteUnsafe(this->current,pvStack_28,(uint)dataToBeWritten);
  return;
}

Assistant:

_NOINLINE void ByteCodeWriter::Data::SlowWrite(__in_bcount(byteSize) const void* data, __in uint byteSize)
    {
        AssertMsg(byteSize > current->RemainingBytes(), "We should not need an extension if there is enough space in the current chunk");
        uint bytesLeftToWrite = byteSize;
        byte* dataToBeWritten = (byte*)data;
        // the next chunk may already be created in the case that we are patching bytecode.
        // If so, we want to move the pointer to the beginning of the buffer
        if (current->nextChunk)
        {
            current->nextChunk->SetCurrentOffset(0);
        }
        while (true)
        {
            uint bytesFree = current->RemainingBytes();
            if (bytesFree >= bytesLeftToWrite)
            {
                current->WriteUnsafe(dataToBeWritten, bytesLeftToWrite);
                break;
            }

            current->WriteUnsafe(dataToBeWritten, bytesFree);
            bytesLeftToWrite -= bytesFree;
            dataToBeWritten += bytesFree;

            // Create a new chunk when needed
            if (!current->nextChunk)
            {
                AddChunk(bytesLeftToWrite);
            }
            current = current->nextChunk;
        }
    }